

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteBitvecSet(Bitvec *p,pgno i)

{
  sxu32 sVar1;
  uint uVar2;
  bitvec_rec *pSrc;
  bitvec_rec **pSrc_00;
  uint local_44;
  sxu32 iBucket;
  sxu32 n;
  bitvec_rec **apNew;
  bitvec_rec *pEntry;
  sxu32 nNewSize;
  sxi32 iBuck;
  bitvec_rec *pRec;
  pgno i_local;
  Bitvec *p_local;
  
  pSrc = (bitvec_rec *)SyMemBackendPoolAlloc(p->pAlloc,0x18);
  if (pSrc == (bitvec_rec *)0x0) {
    p_local._4_4_ = -1;
  }
  else {
    SyZero(pSrc,0x18);
    pSrc->iPage = i;
    uVar2 = (uint)i & p->nSize - 1;
    pSrc->pNextCol = p->apRec[(int)uVar2];
    p->apRec[(int)uVar2] = pSrc;
    pSrc->pNext = p->pList;
    p->pList = pSrc;
    p->nRec = p->nRec + 1;
    if ((p->nSize * 3 <= p->nRec) && (p->nRec < 100000)) {
      sVar1 = p->nSize;
      pSrc_00 = (bitvec_rec **)SyMemBackendAlloc(p->pAlloc,sVar1 << 4);
      if (pSrc_00 != (bitvec_rec **)0x0) {
        SyZero(pSrc_00,sVar1 << 4);
        local_44 = 0;
        apNew = (bitvec_rec **)p->pList;
        for (; local_44 < p->nRec; local_44 = local_44 + 1) {
          apNew[2] = (bitvec_rec *)0x0;
          uVar2 = (uint)*apNew & sVar1 * 2 - 1;
          apNew[2] = pSrc_00[uVar2];
          pSrc_00[uVar2] = (bitvec_rec *)apNew;
          apNew = (bitvec_rec **)apNew[1];
        }
        SyMemBackendFree(p->pAlloc,p->apRec);
        p->apRec = pSrc_00;
        p->nSize = sVar1 * 2;
      }
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

UNQLITE_PRIVATE int unqliteBitvecSet(Bitvec *p,pgno i)
{
	bitvec_rec *pRec;
	sxi32 iBuck;
	/* Allocate a new instance */
	pRec = (bitvec_rec *)SyMemBackendPoolAlloc(p->pAlloc,sizeof(bitvec_rec));
	if( pRec == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pRec,sizeof(bitvec_rec));
	/* Fill-in */
	pRec->iPage = i;
	iBuck = i & (p->nSize - 1);
	pRec->pNextCol = p->apRec[iBuck];
	p->apRec[iBuck] = pRec;
	pRec->pNext = p->pList;
	p->pList = pRec;
	p->nRec++;
	if( p->nRec >= (p->nSize * 3) && p->nRec < 100000 ){
		/* Grow the hashtable */
		sxu32 nNewSize = p->nSize << 1;
		bitvec_rec *pEntry,**apNew;
		sxu32 n;
		apNew = (bitvec_rec **)SyMemBackendAlloc(p->pAlloc, nNewSize * sizeof(bitvec_rec *));
		if( apNew ){
			sxu32 iBucket;
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(bitvec_rec *));
			/* Rehash all entries */
			n = 0;
			pEntry = p->pList;
			for(;;){
				/* Loop one */
				if( n >= p->nRec ){
					break;
				}
				pEntry->pNextCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->iPage & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(p->pAlloc,(void *)p->apRec);
			p->apRec = apNew;
			p->nSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}